

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O2

MPP_RET mpp_meta_dump(MppMeta meta)

{
  MPP_RET MVar1;
  long lVar2;
  
  if (meta == (MppMeta)0x0) {
    _mpp_log_l(2,"mpp_meta","found NULL input\n","mpp_meta_dump");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    _mpp_log_l(4,"mpp_meta","dumping meta %d node count %d\n",(char *)0x0,
               (ulong)*(uint *)((long)meta + 0x28),(ulong)*(uint *)((long)meta + 0x40));
    for (lVar2 = 0; lVar2 != 0x168; lVar2 = lVar2 + 8) {
      if (*(int *)((long)meta + lVar2 * 2 + 0x48) != 0) {
        _mpp_log_l(4,"mpp_meta","key %c%c%c%c - %c\n",(char *)0x0,
                   (ulong)(uint)(int)*(char *)((long)meta_defs + lVar2),
                   (ulong)(uint)(int)*(char *)((long)meta_defs + lVar2 + 1),
                   (ulong)(uint)(int)*(char *)((long)meta_defs + lVar2 + 2),
                   (ulong)(uint)(int)*(char *)((long)meta_defs + lVar2 + 3),
                   (ulong)*(byte *)((long)meta_defs + lVar2 + 4));
      }
    }
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_meta_dump(MppMeta meta)
{
    if (NULL == meta) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppMetaImpl *impl = (MppMetaImpl *)meta;
    RK_U32 i;

    mpp_log("dumping meta %d node count %d\n", impl->meta_id, impl->node_count);

    for (i = 0; i < MPP_ARRAY_ELEMS(meta_defs); i++) {
        if (!impl->vals[i].state)
            continue;

        const char *key = (const char *)&meta_defs[i];

        mpp_log("key %c%c%c%c - %c\n", key[0], key[1], key[2], key[3],
                (meta_defs[i] >> 32) & 0xff);
    }

    return MPP_OK;
}